

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.h
# Opt level: O3

void __thiscall
oout::ContainTest::ContainTest<char_const*>
          (ContainTest *this,shared_ptr<const_oout::Text> *text,string *sub,char *subs)

{
  allocator<char> local_4a;
  undefined1 local_49;
  shared_ptr<oout::ContainMatch> local_48;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,subs,&local_4a);
  local_48.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,std::__cxx11::string_const&>
            (&local_48.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_48,(allocator<oout::ContainMatch> *)&local_49,sub)
  ;
  ContainTest<std::shared_ptr<oout::ContainMatch>>(this,text,&local_38,&local_48);
  if (local_48.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ContainTest(
		const std::shared_ptr<const Text> &text,
		const std::string &sub,
		S ... subs
	) : ContainTest(text, subs..., std::make_shared<ContainMatch>(sub))
	{
	}